

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolBuilders.cpp
# Opt level: O1

void __thiscall
slang::ast::StructBuilder::addField
          (StructBuilder *this,string_view name,Type *fieldType,
          bitmask<slang::ast::VariableFlags> flags)

{
  FieldSymbol *member;
  uint64_t uVar1;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  local_28._M_str = name._M_str;
  local_28._M_len = name._M_len;
  member = BumpAllocator::
           emplace<slang::ast::FieldSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation_const&,unsigned_long&,unsigned_int&>
                     (&this->compilation->super_BumpAllocator,&local_28,
                      (SourceLocation *)&SourceLocation::NoLocation,&this->currBitOffset,
                      &this->currFieldIndex);
  (member->super_VariableSymbol).flags.m_bits = flags.m_bits;
  (member->super_VariableSymbol).super_ValueSymbol.declaredType.type = fieldType;
  Scope::insertMember(&this->type->super_Scope,(Symbol *)member,(this->type->super_Scope).lastMember
                      ,false,true);
  this->currFieldIndex = this->currFieldIndex + 1;
  uVar1 = Type::getSelectableWidth(fieldType);
  uVar1 = uVar1 + this->currBitOffset;
  this->currBitOffset = uVar1;
  this->type->selectableWidth = uVar1;
  return;
}

Assistant:

void StructBuilder::addField(std::string_view name, const Type& fieldType,
                             bitmask<VariableFlags> flags) {
    auto field = compilation.emplace<FieldSymbol>(name, NL, currBitOffset, currFieldIndex);
    field->flags = flags;
    field->setType(fieldType);
    type.addMember(*field);

    currFieldIndex++;
    currBitOffset += fieldType.getSelectableWidth();
    type.selectableWidth = currBitOffset;
}